

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cc
# Opt level: O0

void __thiscall List::Add(List *this,int x)

{
  Node *prev_00;
  Node *this_00;
  Node *curr;
  Node *prev;
  int x_local;
  List *this_local;
  
  prev_00 = Node::getPrev(this->_tail);
  this_00 = (Node *)operator_new(0x18);
  Node::Node(this_00,x);
  if (prev_00 == (Node *)0x0) {
    printf("assertion [");
    printf("prev != __null");
    printf("] fails (%s:%d - %s) ",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/c_intro/list.cc"
           ,0x45,"Add");
    printf("nomsg");
    printf("\n");
    exit(1);
  }
  if (this_00 == (Node *)0x0) {
    printf("assertion [");
    printf("curr != __null");
    printf("] fails (%s:%d - %s) ",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gkthiruvathukal[P]systems-code-examples/c_intro/list.cc"
           ,0x46,"Add");
    printf("nomsg");
    printf("\n");
    exit(1);
  }
  Node::setNext(this_00,this->_tail);
  Node::setPrev(this_00,prev_00);
  Node::setNext(prev_00,this_00);
  Node::setPrev(this->_tail,this_00);
  return;
}

Assistant:

void List::Add(int x)
{
    Node *prev = _tail->getPrev();
    Node *curr = new Node(x);
    assert(prev != NULL)
    assert(curr != NULL)
    curr->setNext(_tail);
    curr->setPrev(prev);
    prev->setNext(curr);
    _tail->setPrev(curr);
}